

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

LY_ERR moveto_scnode_dfs(lyxp_set *set,lysc_node *start,uint32_t start_idx,lys_module *moveto_mod,
                        char *ncname,uint32_t options)

{
  ly_bool lVar1;
  LY_ERR LVar2;
  lysc_node *plVar3;
  lyxp_set *set_00;
  lysc_node *node;
  uint32_t idx;
  uint32_t local_4c;
  lyxp_set *local_48;
  char *local_40;
  lys_module *local_38;
  
  set_00 = set;
  plVar3 = start;
  local_4c = start_idx;
  local_48 = set;
  local_40 = ncname;
  local_38 = moveto_mod;
  while( true ) {
    node = plVar3;
    if (node == (lysc_node *)0x0) {
      return LY_SUCCESS;
    }
    if ((node != start) && ((node->nodetype & 0x82) == 0)) {
      LVar2 = moveto_scnode_check(node,start,set_00,local_40,local_38);
      set_00 = set;
      if (LVar2 == LY_EINVAL) goto LAB_001a513b;
      if (LVar2 == LY_SUCCESS) {
        lVar1 = lyxp_set_scnode_contains(set,node,LYXP_NODE_ELEM,start_idx,&idx);
        if (lVar1 == '\0') {
          LVar2 = lyxp_set_scnode_insert_node
                            (local_48,node,LYXP_NODE_ELEM,LYXP_AXIS_DESCENDANT,(uint32_t *)0x0);
          if (LVar2 != LY_SUCCESS) {
            return LY_EMEM;
          }
        }
        else {
          *(undefined4 *)((long)(local_48->val).nodes + (ulong)idx * 0x18 + 0xc) = 2;
          set_00 = local_48;
          if (local_4c < idx) goto LAB_001a513b;
        }
      }
    }
    plVar3 = lysc_node_child(node);
    if ((plVar3 == (lysc_node *)0x0) ||
       ((set_00 = set,
        plVar3->nodetype == (uint16_t)((ushort)((options & 0x10) == 0) * 0x1000 + 0x1000) &&
        (plVar3 = plVar3->next, plVar3 == (lysc_node *)0x0)))) break;
    while ((plVar3 == (lysc_node *)0x0 && (node = node->parent, node != start))) {
LAB_001a513b:
      plVar3 = node->next;
    }
  }
  set_00 = set;
  if (node != start) goto LAB_001a513b;
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
moveto_scnode_dfs(struct lyxp_set *set, const struct lysc_node *start, uint32_t start_idx,
        const struct lys_module *moveto_mod, const char *ncname, uint32_t options)
{
    const struct lysc_node *next, *elem;
    uint32_t idx;
    LY_ERR rc;

    /* TREE DFS */
    for (elem = next = start; elem; elem = next) {
        if ((elem == start) || (elem->nodetype & (LYS_CHOICE | LYS_CASE))) {
            /* schema-only nodes, skip root */
            goto next_iter;
        }

        rc = moveto_scnode_check(elem, start, set, ncname, moveto_mod);
        if (!rc) {
            if (lyxp_set_scnode_contains(set, elem, LYXP_NODE_ELEM, start_idx, &idx)) {
                set->val.scnodes[idx].in_ctx = LYXP_SET_SCNODE_ATOM_CTX;
                if (idx > start_idx) {
                    /* we will process it later in the set */
                    goto skip_children;
                }
            } else {
                LY_CHECK_RET(lyxp_set_scnode_insert_node(set, elem, LYXP_NODE_ELEM, LYXP_AXIS_DESCENDANT, NULL));
            }
        } else if (rc == LY_EINVAL) {
            goto skip_children;
        }

next_iter:
        /* TREE DFS NEXT ELEM */
        /* select element for the next run - children first */
        next = lysc_node_child(elem);
        if (next && (next->nodetype == LYS_INPUT) && (options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        } else if (next && (next->nodetype == LYS_OUTPUT) && !(options & LYXP_SCNODE_OUTPUT)) {
            next = next->next;
        }
        if (!next) {
skip_children:
            /* no children, so try siblings, but only if it's not the start,
             * that is considered to be the root and it's siblings are not traversed */
            if (elem != start) {
                next = elem->next;
            } else {
                break;
            }
        }
        while (!next) {
            /* no siblings, go back through the parents */
            if (elem->parent == start) {
                /* we are done, no next element to process */
                break;
            }
            /* parent is already processed, go to its sibling */
            elem = elem->parent;
            next = elem->next;
        }
    }

    return LY_SUCCESS;
}